

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void get_range<double,long>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,long *Xc_ind,
               long *Xc_indptr,MissingAction missing_action,double *xmin,double *xmax,
               bool *unsplittable)

{
  long lVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  unsigned_long *puVar8;
  long *plVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  ulong local_60;
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  lVar11 = Xc_indptr[col_num];
  lVar5 = Xc_indptr[col_num + 1];
  bVar12 = true;
  if (lVar5 != lVar11) {
    if (Xc_ind[lVar11] <= (long)ix_arr[end]) {
      lVar1 = lVar5 + -1;
      uVar6 = Xc_ind[lVar1];
      if ((long)ix_arr[st] <= (long)uVar6) {
        puVar3 = ix_arr + end;
        uVar10 = (end - st) + 1;
        if (((long)ix_arr[st] < Xc_ind[lVar11] || (ulong)(lVar5 - lVar11) < uVar10) ||
            (long)uVar6 < (long)ix_arr[end]) {
          *xmin = 0.0;
          *xmax = 0.0;
        }
        puVar2 = puVar3 + 1;
        if (missing_action == Fail) {
          puVar8 = std::__lower_bound<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_val>
                             (ix_arr + st,puVar2,Xc_ind + lVar11);
          local_60 = 0;
          do {
            puVar4 = (ulong *)(Xc_ind + lVar11);
            while( true ) {
              if (((puVar8 == puVar2) || (lVar11 == lVar5)) || (uVar7 = *puVar8, uVar6 < uVar7))
              goto LAB_001cd220;
              if (*puVar4 == uVar7) {
                local_60 = local_60 + 1;
                dVar14 = Xc[lVar11];
                dVar13 = dVar14;
                if (*xmin <= dVar14) {
                  dVar13 = *xmin;
                }
                *xmin = dVar13;
                if (dVar14 <= *xmax) {
                  dVar14 = *xmax;
                }
                *xmax = dVar14;
                if ((puVar8 == puVar3) || (lVar11 == lVar1)) goto LAB_001cd220;
                puVar8 = puVar8 + 1;
                plVar9 = std::__lower_bound<long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                                   (puVar4,Xc_ind + lVar5,puVar8);
                goto LAB_001cd20f;
              }
              if ((long)*puVar4 <= (long)uVar7) break;
              puVar8 = std::__lower_bound<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_val>
                                 (puVar8 + 1,puVar2,puVar4);
            }
            plVar9 = std::__lower_bound<long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                               (puVar4 + 1,Xc_ind + lVar5,puVar8);
LAB_001cd20f:
            lVar11 = (long)plVar9 - (long)Xc_ind >> 3;
          } while( true );
        }
        puVar8 = std::__lower_bound<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_val>
                           (ix_arr + st,puVar2,Xc_ind + lVar11);
        local_60 = 0;
        do {
          puVar4 = (ulong *)(Xc_ind + lVar11);
          while( true ) {
            if (((puVar8 == puVar2) || (lVar11 == lVar5)) || (uVar7 = *puVar8, uVar6 < uVar7))
            goto LAB_001cd220;
            if (*puVar4 == uVar7) {
              local_60 = local_60 + 1;
              dVar14 = Xc[lVar11];
              dVar13 = fmin(*xmin,dVar14);
              *xmin = dVar13;
              dVar14 = fmax(*xmax,dVar14);
              *xmax = dVar14;
              if ((puVar8 == puVar3) || (lVar11 == lVar1)) goto LAB_001cd220;
              puVar8 = puVar8 + 1;
              plVar9 = std::__lower_bound<long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                                 (puVar4,Xc_ind + lVar5,puVar8);
              goto LAB_001cd128;
            }
            if ((long)*puVar4 <= (long)uVar7) break;
            puVar8 = std::__lower_bound<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_val>
                               (puVar8 + 1,puVar2,puVar4);
          }
          plVar9 = std::__lower_bound<long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                             (puVar4 + 1,Xc_ind + lVar5,puVar8);
LAB_001cd128:
          lVar11 = (long)plVar9 - (long)Xc_ind >> 3;
        } while( true );
      }
    }
  }
LAB_001cd29d:
  *unsplittable = bVar12;
  return;
LAB_001cd220:
  dVar14 = *xmin;
  bVar12 = true;
  if (local_60 < uVar10) {
    if (0.0 <= dVar14) {
      dVar14 = 0.0;
    }
    *xmin = dVar14;
    dVar13 = *xmax;
    if (dVar13 <= 0.0) {
      dVar13 = 0.0;
    }
    *xmax = dVar13;
  }
  else {
    dVar13 = *xmax;
  }
  if (((dVar14 != dVar13) || (NAN(dVar14) || NAN(dVar13))) &&
     (dVar14 != INFINITY || dVar13 != -INFINITY)) {
    bVar12 = NAN(dVar13);
  }
  goto LAB_001cd29d;
}

Assistant:

void get_range(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    /* ix_arr must already be sorted beforehand */
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1];
    size_t nnz_col = end_col - st_col;
    end_col--;
    size_t curr_pos = st_col;

    if (!nnz_col || 
        Xc_ind[st_col]         >   (sparse_ix)ix_arr[end] || 
        (sparse_ix)ix_arr[st]  >   Xc_ind[end_col]
        )
    {
        unsplittable = true;
        return;
    }

    if (nnz_col < end - st + 1 ||
        Xc_ind[st_col]  > (sparse_ix)ix_arr[st] ||
        Xc_ind[end_col] < (sparse_ix)ix_arr[end]
        )
    {
        xmin = 0;
        xmax = 0;
    }

    size_t ind_end_col = Xc_ind[end_col];
    size_t nmatches = 0;

    if (missing_action == Fail)
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = (Xc[curr_pos] < xmin)? Xc[curr_pos] : xmin;
                xmax = (Xc[curr_pos] > xmax)? Xc[curr_pos] : xmax;
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    else /* can have NAs */
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = std::fmin(xmin, Xc[curr_pos]);
                xmax = std::fmax(xmax, Xc[curr_pos]);
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

    }

    if (nmatches < (end - st + 1))
    {
        xmin = std::fmin(xmin, 0);
        xmax = std::fmax(xmax, 0);
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}